

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_services.c
# Opt level: O3

int csp_cmp(uint16_t node,uint32_t timeout,uint8_t code,int msg_size,csp_cmp_message *msg)

{
  int iVar1;
  
  msg->type = '\0';
  msg->code = code;
  iVar1 = csp_transaction_w_opts('\x02',node,'\0',timeout,msg,msg_size,msg,msg_size,0x40);
  return (uint)(iVar1 != 0) * 3 + -3;
}

Assistant:

int csp_cmp(uint16_t node, uint32_t timeout, uint8_t code, int msg_size, struct csp_cmp_message * msg) {
	msg->type = CSP_CMP_REQUEST;
	msg->code = code;
	int status = csp_transaction_w_opts(CSP_PRIO_NORM, node, CSP_CMP, timeout, msg, msg_size, msg, msg_size, CSP_O_CRC32);
	if (status == 0) {
		return CSP_ERR_TIMEDOUT;
	}

	return CSP_ERR_NONE;
}